

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence_heat_maps_test.cpp
# Opt level: O1

void __thiscall check_construction_of_heat_maps::test_method(check_construction_of_heat_maps *this)

{
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  filter;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> p;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> q;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_1e8;
  undefined1 local_1d0;
  undefined8 local_1c8;
  shared_count sStack_1c0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_1b8;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> local_1a0;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> local_c8;
  undefined **local_30;
  undefined1 local_28;
  undefined8 *local_20;
  char **local_18;
  
  Gudhi::Persistence_representations::create_Gaussian_filter(&local_1b8,100,1.0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_1e8,&local_1b8);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  Persistence_heat_maps
            (&local_1a0,"data/file_with_diagram",&local_1e8,false,1000,0.0,1.0,0xffffffff);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_1e8);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  print_to_file(&local_1a0,"data/persistence_heat_map_from_file_with_diagram");
  local_c8.discrete = true;
  local_c8.erase_below_diagonal = false;
  local_c8.kernel.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_c8.kernel.super__Function_base._M_functor._8_8_ = 0;
  local_c8.kernel.super__Function_base._M_manager = (_Manager_type)0x0;
  local_c8.kernel._M_invoker = (_Invoker_type)0x0;
  local_c8.interval.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.interval.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.interval.
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.min_ = 0.0;
  local_c8.max_ = 0.0;
  local_c8.heat_map.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.heat_map.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.heat_map.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.number_of_functions_for_vectorization = 1;
  local_c8.number_of_functions_for_projections_to_reals = 1;
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  load_from_file(&local_c8,"data/persistence_heat_map_from_file_with_diagram");
  local_d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_heat_maps_test.cpp"
  ;
  local_d0 = "";
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d8,0x21);
  local_1d0 = Gudhi::Persistence_representations::
              Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
              operator==(&local_1a0,&local_c8);
  local_1c8 = 0;
  sStack_1c0.pi_ = (sp_counted_base *)0x0;
  local_18 = &local_f8;
  local_f8 = "p == q";
  local_f0 = "";
  local_28 = 0;
  local_30 = &PTR__lazy_ostream_00113d08;
  local_20 = &boost::unit_test::lazy_ostream::inst;
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_heat_maps_test.cpp"
  ;
  local_100 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1c0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_c8.heat_map);
  if (local_c8.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8.interval.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.interval.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8.kernel.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_c8.kernel.super__Function_base._M_manager)
              ((_Any_data *)&local_c8.kernel,(_Any_data *)&local_c8.kernel,__destroy_functor);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_1a0.heat_map);
  if (local_1a0.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1a0.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a0.weights.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1a0.interval.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.interval.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a0.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a0.interval.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1a0.kernel.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1a0.kernel.super__Function_base._M_manager)
              ((_Any_data *)&local_1a0.kernel,(_Any_data *)&local_1a0.kernel,__destroy_functor);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_1b8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_construction_of_heat_maps) {
  std::vector<std::vector<double> > filter = create_Gaussian_filter(100, 1);
  Persistence_heat_maps<constant_scaling_function> p("data/file_with_diagram", filter, false, 1000, 0, 1);
  p.print_to_file("data/persistence_heat_map_from_file_with_diagram");

  Persistence_heat_maps<constant_scaling_function> q;
  q.load_from_file("data/persistence_heat_map_from_file_with_diagram");

  BOOST_CHECK(p == q);
}